

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_reader.cc
# Opt level: O3

bool __thiscall xsettingsd::DataReader::ReadInt32(DataReader *this,int32_t *out)

{
  uint uVar1;
  ulong uVar2;
  bool bVar3;
  
  uVar2 = this->bytes_read_;
  bVar3 = uVar2 + 4 <= this->buf_len_;
  if (bVar3 && uVar2 < 0xfffffffffffffffc) {
    if ((out != (int32_t *)0x0) &&
       (*out = *(int32_t *)(this->buffer_ + uVar2), this->reverse_bytes_ == true)) {
      IsLittleEndian();
      uVar1 = *out;
      *out = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    }
    this->bytes_read_ = this->bytes_read_ + 4;
  }
  return bVar3 && uVar2 < 0xfffffffffffffffc;
}

Assistant:

bool DataReader::ReadInt32(int32_t* out) {
  if (bytes_read_ + sizeof(int32_t) > buf_len_ ||
      bytes_read_ + sizeof(int32_t) < bytes_read_) {
    return false;
  }

  if (out) {
    *out = *reinterpret_cast<const int32_t*>(buffer_ + bytes_read_);
    if (reverse_bytes_) {
      if (IsLittleEndian())
        *out = ntohl(*out);
      else
        *out = htonl(*out);
    }
  }
  bytes_read_ += sizeof(int32_t);
  return true;
}